

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::SequenceFeatureType::ByteSizeLong(SequenceFeatureType *this)

{
  bool bVar1;
  TypeCase TVar2;
  int iVar3;
  size_t sVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  SequenceFeatureType *this_local;
  
  sStack_18 = 0;
  bVar1 = has_sizerange(this);
  if (bVar1) {
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::SizeRange>(this->sizerange_);
    sStack_18 = sStack_18 + 2;
  }
  TVar2 = Type_case(this);
  if (TVar2 != TYPE_NOT_SET) {
    if (TVar2 == kInt64Type) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::Int64FeatureType>
                        ((this->Type_).int64type_);
      sStack_18 = sVar4 + 1 + sStack_18;
    }
    else if (TVar2 == kStringType) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::StringFeatureType>
                        ((this->Type_).stringtype_);
      sStack_18 = sVar4 + 1 + sStack_18;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar3;
  return sStack_18;
}

Assistant:

size_t SequenceFeatureType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SequenceFeatureType)
  size_t total_size = 0;

  // .CoreML.Specification.SizeRange sizeRange = 101;
  if (this->has_sizerange()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->sizerange_);
  }

  switch (Type_case()) {
    // .CoreML.Specification.Int64FeatureType int64Type = 1;
    case kInt64Type: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.int64type_);
      break;
    }
    // .CoreML.Specification.StringFeatureType stringType = 3;
    case kStringType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.stringtype_);
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}